

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_errors(vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *errors)

{
  bool bVar1;
  enableStd<rang::style> pbVar2;
  enableStd<rang::bg> pbVar3;
  ostream *poVar4;
  reference pEVar5;
  char *pcVar6;
  ErrorInfoException *it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *__range1;
  vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *errors_local;
  
  pbVar2 = rang::operator<<((ostream *)&std::cout,bold);
  pbVar3 = rang::operator<<(pbVar2,red);
  poVar4 = std::operator<<(pbVar3,anon_var_dwarf_3eb3);
  pbVar2 = rang::operator<<(poVar4,reset);
  pbVar3 = rang::operator<<(pbVar2,reset);
  std::ostream::operator<<(pbVar3,std::endl<char,std::char_traits<char>>);
  rang::operator<<((ostream *)&std::cout,red);
  __end1 = std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>::begin(errors);
  it = (ErrorInfoException *)
       std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>::end(errors);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
                                *)&it);
    if (!bVar1) break;
    pEVar5 = __gnu_cxx::
             __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
             ::operator*(&__end1);
    pcVar6 = (char *)(**(code **)(*(long *)pEVar5 + 0x10))();
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
    ::operator++(&__end1);
  }
  rang::operator<<((ostream *)&std::cout,reset);
  return;
}

Assistant:

void print_errors(const vector<ErrorInfoException> &errors) {
    cout << style::bold << bg::red << "\t\t\t错误表" << style::reset << bg::reset << endl;
    cout << fg::red;
    for (const auto &it : errors) {
        cout << it.what() << endl;
    }
    cout << fg::reset;
}